

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_os_socket_setsockblock(int sock,int block)

{
  int iVar1;
  int in_ESI;
  int in_EDI;
  long arg;
  undefined8 local_18;
  undefined4 local_4;
  
  iVar1 = fcntl(in_EDI,3,0);
  local_18 = (ulong)iVar1;
  if ((long)local_18 < 0) {
    local_4 = -9;
  }
  else {
    if (in_ESI == 0) {
      local_18 = local_18 | 0x800;
    }
    else {
      local_18 = local_18 & 0xfffffffffffff7ff;
    }
    iVar1 = fcntl(in_EDI,4,local_18);
    if (iVar1 < 0) {
      local_4 = -9;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
amqp_os_socket_setsockblock(int sock, int block)
{

#ifdef _WIN32
  int nonblock = !block;
  if (NO_ERROR != ioctlsocket(sock, FIONBIO, &nonblock)) {
    return AMQP_STATUS_SOCKET_ERROR;
  } else {
    return AMQP_STATUS_OK;
  }
#else
  long arg;

  if ((arg = fcntl(sock, F_GETFL, NULL)) < 0) {
     return AMQP_STATUS_SOCKET_ERROR;
  }

  if (block) {
    arg &= (~O_NONBLOCK);
  } else {
    arg |= O_NONBLOCK;
  }

  if (fcntl(sock, F_SETFL, arg) < 0) {
    return AMQP_STATUS_SOCKET_ERROR;
  }

  return AMQP_STATUS_OK;
#endif
}